

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::report_selfint_face
          (tetgenmesh *this,point p1,point p2,point p3,face *sface,triface *iedge,int intflag,
          int *types,int *poss)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  shellface e1;
  shellface e2;
  tetrahedron *pppdVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  char *__format;
  ulong uVar11;
  shellface ppdVar12;
  tetrahedron ppdVar13;
  point pdVar14;
  face iface;
  double ip [3];
  double u;
  
  iface.sh = (shellface *)0x0;
  iface.shver = 0;
  uVar1 = *(uint *)((long)sface->sh + (long)this->shmarkindex * 4);
  ppdVar13 = iedge->tet[9];
  if ((ppdVar13 == (tetrahedron)0x0) || (ppdVar13[iedge->ver & 3] == (double *)0x0)) {
    ppdVar13 = iedge->tet[8];
    if ((ppdVar13 == (tetrahedron)0x0) || (ppdVar13[ver2edge[iedge->ver]] == (double *)0x0)) {
      terminatetetgen(this,2);
      e1 = (shellface)0x0;
      e2 = (shellface)0x0;
      ppdVar12 = (shellface)0x0;
      bVar3 = false;
      uVar5 = 0;
    }
    else {
      tsspivot1(this,iedge,&iface);
      e1 = (shellface)farsorg(this,&iface);
      e2 = (shellface)farsdest(this,&iface);
      uVar5 = *(uint *)(((ulong)iface.sh[iface.shver >> 1] & 0xfffffffffffffff8) +
                       (long)this->shmarkindex * 4);
      bVar3 = true;
      ppdVar12 = (shellface)0x0;
    }
  }
  else {
    tspivot(this,iedge,&iface);
    lVar6 = (long)iface.shver;
    e1 = iface.sh[sorgpivot[lVar6]];
    e2 = iface.sh[sdestpivot[lVar6]];
    ppdVar12 = iface.sh[sapexpivot[lVar6]];
    bVar3 = false;
    uVar5 = uVar1;
  }
  if (intflag == 4) {
    if (*types != 4) goto switchD_001197f4_caseD_2;
    puts("PLC Error:  Two facets are overlapping.");
    lVar6 = (long)this->pointmarkindex;
    printf("  Facet 1:   [%d,%d,%d] #%d\n",(ulong)*(uint *)((long)e1 + lVar6 * 4),
           (ulong)*(uint *)((long)e2 + lVar6 * 4),(ulong)*(uint *)((long)ppdVar12 + lVar6 * 4),
           (ulong)uVar5);
    lVar6 = (long)this->pointmarkindex;
    uVar10 = (ulong)*(uint *)((long)p1 + lVar6 * 4);
    uVar9 = (ulong)*(uint *)((long)p2 + lVar6 * 4);
    uVar7 = (ulong)*(uint *)((long)p3 + lVar6 * 4);
    __format = "  Facet 2:   [%d,%d,%d] #%d\n";
LAB_001199b4:
    uVar11 = (ulong)uVar1;
LAB_001199b9:
    printf(__format,uVar10,uVar9,uVar7,uVar11);
  }
  else {
    if (intflag == 2) {
      u = 0.0;
      planelineint(this,p1,p2,p3,(double *)e1,(double *)e2,ip,&u);
      switch(*types) {
      case 5:
      case 6:
        if (poss[1] == 1) {
          pppdVar4 = iedge->tet;
          iVar2 = iedge->ver;
          piVar8 = destpivot;
LAB_00119a93:
          ppdVar13 = pppdVar4[piVar8[iVar2]];
        }
        else {
          if (poss[1] == 0) {
            pppdVar4 = iedge->tet;
            iVar2 = iedge->ver;
            piVar8 = orgpivot;
            goto LAB_00119a93;
          }
          terminatetetgen(this,2);
          ppdVar13 = (tetrahedron)0x0;
        }
        if (2 < (*(int *)((long)ppdVar13 + (long)this->pointmarkindex * 4 + 4) >> 8) - 6U) {
          printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",*ppdVar13,ppdVar13[1],
                 ppdVar13[2]);
          uVar5 = *(uint *)((long)ppdVar13 + (long)this->pointmarkindex * 4);
LAB_00119b17:
          printf("  Vertex:  #%d\n",(ulong)uVar5);
          lVar6 = (long)this->pointmarkindex;
          uVar10 = (ulong)*(uint *)((long)p1 + lVar6 * 4);
          uVar9 = (ulong)*(uint *)((long)p2 + lVar6 * 4);
          uVar7 = (ulong)*(uint *)((long)p3 + lVar6 * 4);
          __format = "  Facet:   [%d,%d,%d] #%d\n";
          uVar11 = (ulong)uVar1;
          goto LAB_001199b9;
        }
        break;
      case 7:
        iVar2 = *poss;
        pdVar14 = p1;
        if (((iVar2 != 0) && (pdVar14 = p3, iVar2 != 2)) && (pdVar14 = p2, iVar2 != 1)) {
          terminatetetgen(this,2);
          pdVar14 = (point)0x0;
        }
        if (2 < (*(int *)((long)pdVar14 + (long)this->pointmarkindex * 4 + 4) >> 8) - 6U) {
          if (bVar3) {
            printf("PLC Error:  A vertex and a segment intersect at (%g,%g,%g)\n",*pdVar14,
                   pdVar14[1],pdVar14[2]);
            printf("  Vertex:  #%d\n",
                   (ulong)*(uint *)((long)pdVar14 + (long)this->pointmarkindex * 4));
            uVar10 = (ulong)*(uint *)((long)e1 + (long)this->pointmarkindex * 4);
            uVar9 = (ulong)*(uint *)((long)e2 + (long)this->pointmarkindex * 4);
            uVar7 = (ulong)*(uint *)((long)iface.sh + (long)this->shmarkindex * 4);
            __format = "  Segment: [%d,%d] #%d (%d)\n";
            uVar11 = (ulong)uVar5;
            goto LAB_001199b9;
          }
          printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",*pdVar14,pdVar14[1],
                 pdVar14[2]);
          uVar5 = *(uint *)((long)pdVar14 + (long)this->pointmarkindex * 4);
          goto LAB_00119b17;
        }
        break;
      case 8:
      case 9:
        if (bVar3) {
          printf("PLC Error:  A segment and a facet intersect at point");
          printf(" (%g,%g,%g).\n",ip[0],ip[1],ip[2]);
          printf("  Segment: [%d,%d] #%d (%d)\n",
                 (ulong)*(uint *)((long)e1 + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)e2 + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)iface.sh + (long)this->shmarkindex * 4),(ulong)uVar5);
          lVar6 = (long)this->pointmarkindex;
          uVar10 = (ulong)*(uint *)((long)p1 + lVar6 * 4);
          uVar9 = (ulong)*(uint *)((long)p2 + lVar6 * 4);
          uVar7 = (ulong)*(uint *)((long)p3 + lVar6 * 4);
          __format = "  Facet:   [%d,%d,%d] #%d\n";
        }
        else {
          printf("PLC Error:  Two facets intersect at point");
          printf(" (%g,%g,%g).\n",ip[0],ip[1],ip[2]);
          lVar6 = (long)this->pointmarkindex;
          printf("  Facet 1: [%d,%d,%d] #%d\n",(ulong)*(uint *)((long)e1 + lVar6 * 4),
                 (ulong)*(uint *)((long)e2 + lVar6 * 4),
                 (ulong)*(uint *)((long)iface.sh[sorgpivot[iface.shver]] + lVar6 * 4),
                 (ulong)*(uint *)((long)iface.sh + (long)this->shmarkindex * 4));
          lVar6 = (long)this->pointmarkindex;
          uVar10 = (ulong)*(uint *)((long)p1 + lVar6 * 4);
          uVar9 = (ulong)*(uint *)((long)p2 + lVar6 * 4);
          uVar7 = (ulong)*(uint *)((long)p3 + lVar6 * 4);
          __format = "  Facet 2: [%d,%d,%d] #%d\n";
        }
        goto LAB_001199b4;
      }
    }
switchD_001197f4_caseD_2:
    terminatetetgen(this,2);
  }
  terminatetetgen(this,3);
  return 0;
}

Assistant:

int tetgenmesh::report_selfint_face(point p1, point p2, point p3, face* sface,
  triface* iedge, int intflag, int* types, int* poss)
{
  face iface;
  point e1 = NULL, e2 = NULL, e3 = NULL;
  int etype = 0, geomtag = 0, facemark = 0;

  geomtag = shellmark(*sface);

  if (issubface(*iedge)) {
    tspivot(*iedge, iface);
    e1 = sorg(iface);
    e2 = sdest(iface);
    e3 = sapex(iface);
    etype = 2;
    facemark = geomtag;
  } else if (issubseg(*iedge)) {
    tsspivot1(*iedge, iface);
    e1 = farsorg(iface);
    e2 = farsdest(iface);
    etype = 1;
    face parentsh;
    spivot(iface, parentsh);
    facemark = shellmark(parentsh);
  } else {
    terminatetetgen(this, 2);
  }

  if (intflag == 2) {
    // The triangle and the edge intersect only at one point.
    REAL ip[3], u = 0;
    planelineint(p1, p2, p3, e1, e2, ip, &u);
    if ((types[0] == (int) ACROSSFACE) ||
        (types[0] == (int) ACROSSEDGE)) {
      // The triangle and the edge intersect in their interiors. 
      if (etype == 1) {
        printf("PLC Error:  A segment and a facet intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Segment: [%d,%d] #%d (%d)\n", pointmark(e1), pointmark(e2),
               shellmark(iface), facemark);
        printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      } else {
        printf("PLC Error:  Two facets intersect at point");
        printf(" (%g,%g,%g).\n", ip[0], ip[1], ip[2]);
        printf("  Facet 1: [%d,%d,%d] #%d\n", pointmark(e1), pointmark(e2),
               pointmark(sorg(iface)), shellmark(iface));
        printf("  Facet 2: [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      }
    } else if (types[0] == (int) ACROSSVERT) {
      // A vertex of the triangle and the edge intersect.
      point crosspt = NULL;
      if (poss[0] == 0) {
        crosspt = p1;
      } else if (poss[0] == 1) {
        crosspt = p2;
      } else if (poss[0] == 2) {
        crosspt = p3;
      } else {
        terminatetetgen(this, 2);
      }
      if (!issteinerpoint(crosspt)) {
        if (etype == 1) {
          printf("PLC Error:  A vertex and a segment intersect at (%g,%g,%g)\n",
                 crosspt[0], crosspt[1], crosspt[2]);
          printf("  Vertex:  #%d\n", pointmark(crosspt));
          printf("  Segment: [%d,%d] #%d (%d)\n", pointmark(e1), pointmark(e2),
                 shellmark(iface), facemark);
        } else {
          printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",
                 crosspt[0], crosspt[1], crosspt[2]);
          printf("  Vertex:  #%d\n", pointmark(crosspt));
          printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
                 pointmark(p2), pointmark(p3), geomtag);
        }
      } else {
        // It is a Steiner point. To be processed.
        terminatetetgen(this, 2);
      }
    } else if ((types[0] == (int) TOUCHFACE) ||
               (types[0] == (int) TOUCHEDGE)) {
      // The triangle and a vertex of the edge intersect.
      point touchpt = NULL;
      if (poss[1] == 0) {
        touchpt = org(*iedge);
      } else if (poss[1] == 1) {
        touchpt = dest(*iedge);
      } else {
        terminatetetgen(this, 2);
      }
      if (!issteinerpoint(touchpt)) {
        printf("PLC Error:  A vertex and a facet intersect at (%g,%g,%g)\n",
               touchpt[0], touchpt[1], touchpt[2]);
        printf("  Vertex:  #%d\n", pointmark(touchpt));
        printf("  Facet:   [%d,%d,%d] #%d\n", pointmark(p1), 
               pointmark(p2), pointmark(p3), geomtag);
      } else {
        // It is a Steiner point. To be processed.
        terminatetetgen(this, 2);
      }
    } else if (types[0] == (int) SHAREVERT) {
      terminatetetgen(this, 2);
    } else {
      terminatetetgen(this, 2);
    }
  } else if (intflag == 4) {
    if (types[0] == (int) SHAREFACE) {
      printf("PLC Error:  Two facets are overlapping.\n");
      printf("  Facet 1:   [%d,%d,%d] #%d\n", pointmark(e1), 
             pointmark(e2), pointmark(e3), facemark);
      printf("  Facet 2:   [%d,%d,%d] #%d\n", pointmark(p1), 
             pointmark(p2), pointmark(p3), geomtag);
    } else {
      terminatetetgen(this, 2);
    }
  } else {
    terminatetetgen(this, 2);
  }

  terminatetetgen(this, 3);
  return 0;
}